

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O3

mcpl_generic_filehandle_t *
mcpl_generic_fopen_try(mcpl_generic_filehandle_t *__return_storage_ptr__,char *filename)

{
  int iVar1;
  char *__s1;
  MCTOOLS_FILE_t *pMVar2;
  gzFile pgVar3;
  mcu8str f;
  mcu8str local_30;
  
  __return_storage_ptr__->internal = (void *)0x0;
  __return_storage_ptr__->current_pos = 0;
  __return_storage_ptr__->mode = 0;
  __s1 = strrchr(filename,0x2e);
  if ((__s1 != (char *)0x0) && (iVar1 = strcmp(__s1,".gz"), iVar1 == 0)) {
    pgVar3 = mcpl_gzopen(filename,"rb");
    __return_storage_ptr__->internal = pgVar3;
    __return_storage_ptr__->mode = 1;
    return __return_storage_ptr__;
  }
  mcu8str_view_cstr(&local_30,filename);
  pMVar2 = mctools_fopen(&local_30,"rb");
  __return_storage_ptr__->internal = pMVar2;
  return __return_storage_ptr__;
}

Assistant:

mcpl_generic_filehandle_t mcpl_generic_fopen_try( const char * filename )
{
  mcpl_generic_filehandle_t res;
  res.mode = 0;
  res.current_pos = 0;
  res.internal = NULL;

  const char * lastdot = strrchr(filename, '.');
  if (lastdot && strcmp(lastdot, ".gz") == 0) {
    MCPL_STATIC_ASSERT( sizeof(gzFile) == sizeof(void*) );
    res.internal = (void*)mcpl_gzopen( filename, "rb" );
    res.mode = 0x1;
  } else {
    res.internal = (void*)mcpl_internal_fopen(filename,"rb");
  }
  return res;
}